

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O1

REF_STATUS ref_interp_locate_nearest(REF_INTERP ref_interp)

{
  REF_MPI ref_mpi;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  uint uVar1;
  REF_STATUS RVar2;
  int cell;
  REF_SEARCH ref_search;
  REF_BOOL increase_fuzz;
  REF_DBL radius;
  REF_DBL center [3];
  REF_INT nodes [27];
  REF_SEARCH local_e0;
  REF_BOOL local_d4;
  double local_d0;
  REF_DBL local_c8 [4];
  REF_INT local_a8 [30];
  
  ref_mpi = ref_interp->ref_mpi;
  ref_cell = ref_interp->from_tri;
  ref_node = ref_interp->from_grid->node;
  if ((ref_interp->instrument == 0) || (uVar1 = ref_mpi_stopwatch_start(ref_mpi), uVar1 == 0)) {
    uVar1 = ref_interp_seed_tree(ref_interp);
    if (uVar1 == 0) {
      if ((ref_interp->instrument == 0) ||
         (uVar1 = ref_mpi_stopwatch_stop(ref_mpi,"seed tree"), uVar1 == 0)) {
        uVar1 = ref_interp_process_agents(ref_interp);
        if (uVar1 == 0) {
          if ((ref_interp->instrument == 0) ||
             (uVar1 = ref_mpi_stopwatch_stop(ref_mpi,"drain"), uVar1 == 0)) {
            local_d4 = 0;
            uVar1 = ref_interp_tree(ref_interp,&local_d4);
            if (uVar1 == 0) {
              if ((ref_interp->instrument == 0) ||
                 (uVar1 = ref_mpi_stopwatch_stop(ref_mpi,"tree"), uVar1 == 0)) {
                if (local_d4 != 0) {
                  uVar1 = ref_search_create(&local_e0,ref_cell->n);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                           ,0x73b,"ref_interp_locate_nearest",(ulong)uVar1,"create search");
                    return uVar1;
                  }
                  if (0 < ref_cell->max) {
                    cell = 0;
                    do {
                      RVar2 = ref_cell_nodes(ref_cell,cell,local_a8);
                      if (RVar2 == 0) {
                        uVar1 = ref_node_bounding_sphere(ref_node,local_a8,3,local_c8,&local_d0);
                        if (uVar1 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                 ,0x73d,"ref_interp_locate_nearest",(ulong)uVar1,"b");
                          return uVar1;
                        }
                        uVar1 = ref_search_insert(local_e0,cell,local_c8,
                                                  ref_interp->search_donor_scale * local_d0);
                        if (uVar1 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                 ,0x740,"ref_interp_locate_nearest",(ulong)uVar1,"ins");
                          return uVar1;
                        }
                      }
                      cell = cell + 1;
                    } while (cell < ref_cell->max);
                  }
                  uVar1 = ref_interp_nearest_tet_via_tri_in_tree(ref_interp,local_e0);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                           ,0x743,"ref_interp_locate_nearest",(ulong)uVar1,"near tri");
                    return uVar1;
                  }
                  uVar1 = ref_search_free(local_e0);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                           ,0x744,"ref_interp_locate_nearest",(ulong)uVar1,"free search");
                    return uVar1;
                  }
                }
                uVar1 = 0;
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0x738,"ref_interp_locate_nearest",(ulong)uVar1,"locate clock");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,0x736,"ref_interp_locate_nearest",(ulong)uVar1,"tree");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x733,"ref_interp_locate_nearest",(ulong)uVar1,"locate clock");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x731,"ref_interp_locate_nearest",(ulong)uVar1,"drain");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x72f,"ref_interp_locate_nearest",(ulong)uVar1,"locate clock");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x72d,"ref_interp_locate_nearest",(ulong)uVar1,"seed tree nodes");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x72b,
           "ref_interp_locate_nearest",(ulong)uVar1,"locate clock");
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_interp_locate_nearest(REF_INTERP ref_interp) {
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_GRID from_grid = ref_interp_from_grid(ref_interp);

  REF_CELL from_tri = ref_interp_from_tri(ref_interp);
  REF_NODE from_node = ref_grid_node(from_grid);

  REF_BOOL increase_fuzz;
  REF_SEARCH ref_search;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL center[3], radius;

  if (ref_interp->instrument)
    RSS(ref_mpi_stopwatch_start(ref_mpi), "locate clock");

  RSS(ref_interp_seed_tree(ref_interp), "seed tree nodes");
  if (ref_interp->instrument)
    RSS(ref_mpi_stopwatch_stop(ref_mpi, "seed tree"), "locate clock");

  RSS(ref_interp_process_agents(ref_interp), "drain");
  if (ref_interp->instrument)
    RSS(ref_mpi_stopwatch_stop(ref_mpi, "drain"), "locate clock");

  increase_fuzz = REF_FALSE;
  RSS(ref_interp_tree(ref_interp, &increase_fuzz), "tree");
  if (ref_interp->instrument)
    RSS(ref_mpi_stopwatch_stop(ref_mpi, "tree"), "locate clock");

  if (increase_fuzz) {
    RSS(ref_search_create(&ref_search, ref_cell_n(from_tri)), "create search");
    each_ref_cell_valid_cell_with_nodes(from_tri, cell, nodes) {
      RSS(ref_node_bounding_sphere(from_node, nodes, 3, center, &radius), "b");
      RSS(ref_search_insert(ref_search, cell, center,
                            ref_interp_search_donor_scale(ref_interp) * radius),
          "ins");
    }
    RSS(ref_interp_nearest_tet_via_tri_in_tree(ref_interp, ref_search),
        "near tri");
    RSS(ref_search_free(ref_search), "free search");
  }

  return REF_SUCCESS;
}